

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

int __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::ConnectOrder
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,int connect)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  uint uVar4;
  stringstream sout;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  uVar4 = 0xffffffff;
  if (-1 < connect) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))();
    if (connect < iVar1) {
      if ((this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)connect] == -1) {
        std::__cxx11::stringstream::stringstream(local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_190,
                   "virtual int TPZCompElHDiv<pzshape::TPZShapeLinear>::ConnectOrder(int) const [TSHAPE = pzshape::TPZShapeLinear]"
                   ,0x6e);
        std::__ostream_insert<char,std::char_traits<char>>(local_190," connect ",9);
        poVar3 = (ostream *)std::ostream::operator<<(local_190,connect);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not initialized",0x13);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1c0,local_1b8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if (local_1c0 != local_1b0) {
          operator_delete(local_1c0,local_1b0[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1a0);
        std::ios_base::~ios_base(local_120);
        uVar4 = 0;
      }
      else {
        lVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0xa8))(this,(ulong)(uint)connect);
        uVar4 = (uint)*(byte *)(lVar2 + 0x14);
      }
    }
  }
  return uVar4;
}

Assistant:

int TPZCompElHDiv<TSHAPE>::ConnectOrder(int connect) const{
	if (connect < 0 || connect >= this->NConnects()){
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Connect index out of range connect " << connect <<
			" nconnects " << NConnects();
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		return -1;
	}

	if (this->fConnectIndexes[connect] == -1) {
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " connect " << connect
		<< " is not initialized" << std::endl;
#ifdef PZ_LOG
		LOGPZ_ERROR(logger,sout.str());
#else
		std::cout << sout.str() << std::endl;
#endif
		return 0;
	}

    TPZConnect &c = this-> Connect(connect);
    return c.Order();
}